

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

char * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::rec_serialize
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *this,Siblings *sib,
          char *buffer)

{
  bool bVar1;
  Dictionary *this_00;
  size_type sVar2;
  char *start;
  Filtration_value *value;
  reference ppVar3;
  Siblings *sib_00;
  pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
  *map_el_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  Dictionary *__range2_1;
  pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
  *map_el;
  const_iterator __end0;
  const_iterator __begin0;
  Dictionary *__range2;
  char *ptr;
  char *buffer_local;
  Siblings *sib_local;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *this_local;
  
  this_00 = Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>_>
            ::members(sib);
  sVar2 = boost::container::
          flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>
          ::size(this_00);
  __range2 = (Dictionary *)serialize_value_to_char_buffer<short>((short)sVar2,buffer);
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>_>
  ::members(sib);
  boost::container::
  flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>
  ::begin((flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>
           *)&__end0);
  boost::container::
  flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>
  ::end((flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>
         *)&map_el);
  while( true ) {
    bVar1 = boost::container::operator!=
                      (&__end0,(vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
                                *)&map_el);
    if (!bVar1) break;
    ppVar3 = boost::container::
             vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
             ::operator*(&__end0);
    start = serialize_value_to_char_buffer<short>(ppVar3->first,(char *)__range2);
    value = Filtration_simplex_base_real::filtration
                      (&(ppVar3->second).super_Filtration_simplex_base);
    __range2 = (Dictionary *)serialize_value_to_char_buffer(value,start);
    boost::container::
    vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
    ::operator++(&__end0);
  }
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>_>
  ::members(sib);
  boost::container::
  flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>
  ::begin((flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>
           *)&__end0_1);
  boost::container::
  flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>
  ::end((flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>,_std::less<short>,_void>
         *)&map_el_1);
  while( true ) {
    bVar1 = boost::container::operator!=
                      (&__end0_1,
                       (vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
                        *)&map_el_1);
    if (!bVar1) break;
    ppVar3 = boost::container::
             vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
             ::operator*(&__end0_1);
    bVar1 = has_children<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>>>const*>
                      (this,ppVar3);
    if (bVar1) {
      sib_00 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>
               ::children(&ppVar3->second);
      __range2 = (Dictionary *)rec_serialize(this,sib_00,(char *)__range2);
    }
    else {
      __range2 = (Dictionary *)serialize_value_to_char_buffer<short>(0,(char *)__range2);
    }
    boost::container::
    vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
    ::operator++(&__end0_1);
  }
  return (char *)__range2;
}

Assistant:

char* rec_serialize(Siblings const *sib, char* buffer) const {
    char* ptr = buffer;
    ptr = serialize_value_to_char_buffer(static_cast<Vertex_handle>(sib->members().size()), ptr);
#ifdef DEBUG_TRACES
    std::clog << "\n" << sib->members().size() << " : ";
#endif  // DEBUG_TRACES
    for (auto& map_el : sib->members()) {
      ptr = serialize_value_to_char_buffer(map_el.first, ptr); // Vertex
      if (Options::store_filtration)
        ptr = serialize_value_to_char_buffer(map_el.second.filtration(), ptr); // Filtration
#ifdef DEBUG_TRACES
      std::clog << " [ " << map_el.first << " | " << map_el.second.filtration() << " ] ";
#endif  // DEBUG_TRACES
    }
    for (auto& map_el : sib->members()) {
      if (has_children(&map_el)) {
        ptr = rec_serialize(map_el.second.children(), ptr);
      } else {
        ptr = serialize_value_to_char_buffer(static_cast<Vertex_handle>(0), ptr);
#ifdef DEBUG_TRACES
        std::cout << "\n0 : ";
#endif  // DEBUG_TRACES
      }
    }
    return ptr;
  }